

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_append_str_utf8(nk_str *str,char *text)

{
  nk_rune local_34;
  int local_30;
  nk_rune unicode;
  int glyph_len;
  int num_runes;
  int byte_len;
  int runes;
  char *text_local;
  nk_str *str_local;
  
  num_runes = 0;
  glyph_len = 0;
  unicode = 0;
  local_30 = 0;
  if ((str == (nk_str *)0x0) || (text == (char *)0x0)) {
    str_local._4_4_ = 0;
  }
  else {
    _byte_len = text;
    text_local = (char *)str;
    local_30 = nk_utf_decode(text,&local_34,4);
    glyph_len = local_30;
    while (local_34 != 0 && local_30 != 0) {
      local_30 = nk_utf_decode(_byte_len + glyph_len,&local_34,4);
      glyph_len = local_30 + glyph_len;
      unicode = unicode + 1;
    }
    nk_str_append_text_char((nk_str *)text_local,_byte_len,glyph_len);
    str_local._4_4_ = num_runes;
  }
  return str_local._4_4_;
}

Assistant:

NK_API int
nk_str_append_str_utf8(struct nk_str *str, const char *text)
{
    int runes = 0;
    int byte_len = 0;
    int num_runes = 0;
    int glyph_len = 0;
    nk_rune unicode;
    if (!str || !text) return 0;

    glyph_len = byte_len = nk_utf_decode(text+byte_len, &unicode, 4);
    while (unicode != '\0' && glyph_len) {
        glyph_len = nk_utf_decode(text+byte_len, &unicode, 4);
        byte_len += glyph_len;
        num_runes++;
    }
    nk_str_append_text_char(str, text, byte_len);
    return runes;
}